

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

char * mbedtls_ssl_get_version(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_protocol_version mVar1;
  char *pcVar2;
  char *pcVar3;
  
  mVar1 = ssl->tls_version;
  if (ssl->conf->transport == '\x01') {
    pcVar2 = "unknown (DTLS)";
    if (mVar1 == MBEDTLS_SSL_VERSION_TLS1_2) {
      pcVar2 = "DTLSv1.2";
    }
  }
  else {
    pcVar3 = "unknown";
    if (mVar1 == MBEDTLS_SSL_VERSION_TLS1_3) {
      pcVar3 = "TLSv1.3";
    }
    pcVar2 = "TLSv1.2";
    if (mVar1 != MBEDTLS_SSL_VERSION_TLS1_2) {
      pcVar2 = pcVar3;
    }
  }
  return pcVar2;
}

Assistant:

const char *mbedtls_ssl_get_version(const mbedtls_ssl_context *ssl)
{
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        switch (ssl->tls_version) {
            case MBEDTLS_SSL_VERSION_TLS1_2:
                return "DTLSv1.2";
            default:
                return "unknown (DTLS)";
        }
    }
#endif

    switch (ssl->tls_version) {
        case MBEDTLS_SSL_VERSION_TLS1_2:
            return "TLSv1.2";
        case MBEDTLS_SSL_VERSION_TLS1_3:
            return "TLSv1.3";
        default:
            return "unknown";
    }
}